

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O3

void __thiscall
IncrementalEditDistance::IncrementalEditDistance
          (IncrementalEditDistance *this,string *target,size_t subst_cost,size_t ins_cost,
          size_t del_cost)

{
  pointer pcVar1;
  size_t *psVar2;
  size_t sVar3;
  ulong uVar4;
  
  (this->target)._M_dataplus._M_p = (pointer)&(this->target).field_2;
  pcVar1 = (target->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->target,pcVar1,pcVar1 + target->_M_string_length);
  this->subst_cost = subst_cost;
  this->ins_cost = ins_cost;
  this->del_cost = del_cost;
  this->N = target->_M_string_length;
  (this->output_string)._M_dataplus._M_p = (pointer)&(this->output_string).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->output_string,"");
  (this->A).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->A).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->A).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar4 = -(ulong)(this->N + 1 >> 0x3d != 0) | this->N * 8 + 8;
  psVar2 = (size_t *)operator_new__(uVar4);
  this->prev_row = psVar2;
  psVar2 = (size_t *)operator_new__(uVar4);
  this->cur_row = psVar2;
  sVar3 = 0;
  uVar4 = 0;
  do {
    this->prev_row[uVar4] = sVar3;
    uVar4 = uVar4 + 1;
    sVar3 = sVar3 + del_cost;
  } while (uVar4 <= this->N);
  this->prev_row_min = 0;
  return;
}

Assistant:

IncrementalEditDistance(string& target, size_t subst_cost=1, size_t ins_cost=1, size_t del_cost=1)
    : target(target), subst_cost(subst_cost), ins_cost(ins_cost), del_cost(del_cost), N(target.length()), output_string("")
  { prev_row = new size_t[N+1];
    cur_row  = new size_t[N+1];

    for (size_t n=0; n<=N; n++)
      prev_row[n] = del_cost * n;

    prev_row_min = 0;
  }